

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * compatibilityAgree_abi_cxx11_
                   (string *__return_storage_ptr__,CompatibleType t,bool dominant)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  
  if (t - NumberMinType < 2) {
    pcVar3 = "(Ignored)\n";
    if (dominant) {
      pcVar3 = "(Dominant)\n";
    }
    lVar1 = 10;
  }
  else {
    if (StringType < t) {
      __assert_fail("false && \"Unreachable!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorTarget.cxx"
                    ,0xed5,"std::string compatibilityAgree(CompatibleType, bool)");
    }
    pcVar3 = "(Agree)\n";
    if (dominant) {
      pcVar3 = "(Disagree)\n";
    }
    lVar1 = 8;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar2 = 0xb;
  if (!dominant) {
    lVar2 = lVar1;
  }
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar3,pcVar3 + lVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string compatibilityAgree(CompatibleType t, bool dominant)
{
  switch (t) {
    case BoolType:
    case StringType:
      return dominant ? "(Disagree)\n" : "(Agree)\n";
    case NumberMaxType:
    case NumberMinType:
      return dominant ? "(Dominant)\n" : "(Ignored)\n";
  }
  assert(false && "Unreachable!");
  return "";
}